

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper4.cpp
# Opt level: O2

void test_static_open_close_all(planck_unit_test_t *tc)

{
  planck_unit_result_t pVar1;
  Dictionary<int,_int> *pDVar2;
  
  pDVar2 = (Dictionary<int,_int> *)operator_new(0x80);
  BppTree<int,_int>::BppTree((BppTree<int,_int> *)pDVar2,1,key_type_numeric_signed,4,4);
  pVar1 = planck_unit_assert_int_are_equal
                    (tc,0,(int)(pDVar2->dict).status,0x2d9,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
                    );
  if (pVar1 != '\0') {
    cpp_wrapper_static_open_close(tc,pDVar2,0x42,0xc);
    pDVar2 = (Dictionary<int,_int> *)operator_new(0x80);
    FlatFile<int,_int>::FlatFile((FlatFile<int,_int> *)pDVar2,1,key_type_numeric_signed,4,4,0x1e);
    pVar1 = planck_unit_assert_int_are_equal
                      (tc,0,(int)(pDVar2->dict).status,0x2dd,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
                      );
    if (pVar1 != '\0') {
      cpp_wrapper_static_open_close(tc,pDVar2,0x2d,0xe);
      pDVar2 = (Dictionary<int,_int> *)operator_new(0x80);
      OpenAddressHash<int,_int>::OpenAddressHash
                ((OpenAddressHash<int,_int> *)pDVar2,1,key_type_numeric_signed,4,4,0x32);
      pVar1 = planck_unit_assert_int_are_equal
                        (tc,0,(int)(pDVar2->dict).status,0x2e1,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
                        );
      if (pVar1 != '\0') {
        cpp_wrapper_static_open_close(tc,pDVar2,3,0xf);
        pDVar2 = (Dictionary<int,_int> *)operator_new(0x80);
        OpenAddressFileHash<int,_int>::OpenAddressFileHash
                  ((OpenAddressFileHash<int,_int> *)pDVar2,1,key_type_numeric_signed,4,4,0x32);
        pVar1 = planck_unit_assert_int_are_equal
                          (tc,0,(int)(pDVar2->dict).status,0x2e5,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
                          );
        if (pVar1 != '\0') {
          cpp_wrapper_static_open_close(tc,pDVar2,5,0xc);
          pDVar2 = (Dictionary<int,_int> *)operator_new(0x80);
          SkipList<int,_int>::SkipList((SkipList<int,_int> *)pDVar2,1,key_type_numeric_signed,4,4,7)
          ;
          pVar1 = planck_unit_assert_int_are_equal
                            (tc,0,(int)(pDVar2->dict).status,0x2e9,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
                            );
          if (pVar1 != '\0') {
            cpp_wrapper_static_open_close(tc,pDVar2,1,0xd);
            return;
          }
        }
      }
    }
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_static_open_close_all(
	planck_unit_test_t *tc
) {
	Dictionary<int, int> *dictionary;

	dictionary = new BppTree<int, int>(1, key_type_numeric_signed, sizeof(int), sizeof(int));
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, ion_dictionary_status_ok, dictionary->dict.status);
	cpp_wrapper_static_open_close(tc, dictionary, 66, 12);

	dictionary = new FlatFile<int, int>(1, key_type_numeric_signed, sizeof(int), sizeof(int), 30);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, ion_dictionary_status_ok, dictionary->dict.status);
	cpp_wrapper_static_open_close(tc, dictionary, 45, 14);

	dictionary = new OpenAddressHash<int, int>(1, key_type_numeric_signed, sizeof(int), sizeof(int), 50);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, ion_dictionary_status_ok, dictionary->dict.status);
	cpp_wrapper_static_open_close(tc, dictionary, 3, 15);

	dictionary = new OpenAddressFileHash<int, int>(1, key_type_numeric_signed, sizeof(int), sizeof(int), 50);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, ion_dictionary_status_ok, dictionary->dict.status);
	cpp_wrapper_static_open_close(tc, dictionary, 5, 12);

	dictionary = new SkipList<int, int>(1, key_type_numeric_signed, sizeof(int), sizeof(int), 7);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, ion_dictionary_status_ok, dictionary->dict.status);
	cpp_wrapper_static_open_close(tc, dictionary, 1, 13);

	/* Uncomment when LinearHash dictionary open memory issue fixed. */
/*	dictionary = new LinearHash<int, int>(1, key_type_numeric_signed, sizeof(int), sizeof(int), 7); */
/*	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, ion_dictionary_status_ok, dictionary->dict.status); */
/*	cpp_wrapper_static_open_close(tc, dictionary, 2, 22); */
}